

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O3

ON_Brep * __thiscall ON_Brep::SubBrep(ON_Brep *this,int subfi_count,int *subfi,ON_Brep *sub_brep)

{
  ON_Object *src;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ON_BrepVertex *pOVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ON_3dPoint vertex_point;
  ulong new_capacity;
  unsigned_short uVar22;
  unsigned_short uVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  uint uVar27;
  int *__s;
  int *__s_00;
  long lVar28;
  ON_BrepLoop *pOVar29;
  ON_Brep *pOVar30;
  ON_BrepTrim *pOVar31;
  ON_BrepEdge *pOVar32;
  ON_BrepVertex *this_00;
  undefined4 extraout_var;
  ON_BrepEdge *this_01;
  undefined4 extraout_var_00;
  ON_BrepFace *pOVar33;
  ON_BrepLoop *loop;
  undefined4 extraout_var_01;
  ON_BrepTrim *pOVar34;
  long lVar35;
  ulong uVar36;
  char *sFormat;
  int iVar37;
  ulong uVar38;
  ON_BrepFace *pOVar39;
  int iVar40;
  long lVar41;
  ON_Curve *c2;
  ON_BoundingBox sub_bbox;
  ON_Surface *srf;
  int local_124;
  ON_Brep *local_118;
  uint local_f8;
  uint local_f4;
  int local_d0;
  ON_Curve *local_b8;
  LeakStopper local_b0;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  ON_Workspace::ON_Workspace(&local_b0.super_ON_Workspace);
  local_b0.m_p = (ON_Brep *)0x0;
  local_b0.m_sub_brep = (ON_Brep *)0x0;
  if (sub_brep != (ON_Brep *)0x0) {
    Destroy(sub_brep);
  }
  if ((subfi == (int *)0x0 || subfi_count < 1) ||
     (local_124 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count, local_124 < subfi_count)) {
LAB_0040cb51:
    local_118 = (ON_Brep *)0x0;
  }
  else {
    __s = ON_Workspace::GetIntMemory
                    (&local_b0.super_ON_Workspace,
                     (long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                           super_ON_ClassArray<ON_BrepEdge>.m_count);
    local_118 = (ON_Brep *)0x0;
    memset(__s,0,(long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                       super_ON_ClassArray<ON_BrepEdge>.m_count << 2);
    __s_00 = ON_Workspace::GetIntMemory
                       (&local_b0.super_ON_Workspace,
                        (long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                              super_ON_ClassArray<ON_BrepVertex>.m_count);
    memset(__s_00,0,(long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                          super_ON_ClassArray<ON_BrepVertex>.m_count << 2);
    new_capacity = (ulong)(uint)subfi_count;
    local_d0 = -1;
    uVar38 = 0;
    uVar1 = 0;
    local_f8 = 0;
    local_f4 = 0;
    uVar27 = 0;
    do {
      iVar40 = subfi[uVar38];
      lVar28 = (long)iVar40;
      iVar37 = 0x443;
      if ((lVar28 < 0) ||
         ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
          iVar40)) {
        sFormat = "ON_Brep::SubBrep sub_fi[] has invalid indices";
LAB_0040ce6a:
        local_118 = (ON_Brep *)0x0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_region.cpp"
                   ,iVar37,"",sFormat);
        goto LAB_0040cb5a;
      }
      iVar37 = local_124;
      iVar24 = iVar40;
      if (((iVar40 <= local_d0) && (iVar37 = iVar40, iVar24 = local_d0, local_124 <= iVar40)) &&
         (iVar37 = local_124, uVar38 != 0)) {
        uVar36 = 0;
        do {
          if (subfi[uVar36] == iVar40) {
            iVar37 = 0x450;
            sFormat = "ON_Brep::SubBrep sub_fi[] has duplicate indices";
            goto LAB_0040ce6a;
          }
          uVar36 = uVar36 + 1;
        } while (uVar38 != uVar36);
      }
      local_d0 = iVar24;
      local_124 = iVar37;
      pOVar39 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      if (0 < pOVar39[lVar28].m_li.m_count) {
        pOVar39 = pOVar39 + lVar28;
        iVar40 = 0;
        do {
          pOVar29 = ON_BrepFace::Loop(pOVar39,iVar40);
          if ((pOVar29 == (ON_BrepLoop *)0x0) ||
             (pOVar30 = ON_BrepLoop::Brep(pOVar29), pOVar30 != this)) goto LAB_0040cb5a;
          if (0 < (pOVar29->m_ti).m_count) {
            iVar37 = 0;
            do {
              pOVar31 = ON_BrepLoop::Trim(pOVar29,iVar37);
              if ((pOVar31 == (ON_BrepTrim *)0x0) ||
                 (pOVar30 = ON_BrepTrim::Brep(pOVar31), pOVar30 != this)) goto LAB_0040cb5a;
              lVar28 = (long)pOVar31->m_vi[0];
              if ((lVar28 < 0) ||
                 (((uVar2 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                            super_ON_ClassArray<ON_BrepVertex>.m_count,
                   (int)uVar2 <= pOVar31->m_vi[0] || (uVar3 = pOVar31->m_vi[1], (int)uVar3 < 0)) ||
                  (uVar2 <= uVar3)))) goto LAB_0040cb5a;
              if (__s_00[lVar28] == 0) {
                __s_00[lVar28] = 1;
                uVar27 = uVar27 + 1;
                uVar3 = pOVar31->m_vi[1];
              }
              if (__s_00[(int)uVar3] == 0) {
                __s_00[(int)uVar3] = 1;
                uVar27 = uVar27 + 1;
              }
              if ((pOVar31->m_type | mated) == ptonsrf) {
                if ((-1 < pOVar31->m_ei) || (pOVar31->m_vi[0] != pOVar31->m_vi[1]))
                goto LAB_0040cb5a;
              }
              else {
                if (((pOVar31->m_ei < 0) ||
                    (pOVar32 = ON_BrepTrim::Edge(pOVar31), pOVar32 == (ON_BrepEdge *)0x0)) ||
                   (pOVar30 = ON_BrepEdge::Brep(pOVar32), pOVar30 != this)) goto LAB_0040cb5a;
                if (__s[pOVar31->m_ei] == 0) {
                  __s[pOVar31->m_ei] = 1;
                  if ((__s_00[pOVar32->m_vi[0]] == 0) || (__s_00[pOVar32->m_vi[1]] == 0))
                  goto LAB_0040cb5a;
                  local_f4 = local_f4 + 1;
                }
              }
              iVar37 = iVar37 + 1;
            } while (iVar37 < (pOVar29->m_ti).m_count);
            local_f8 = local_f8 + iVar37;
          }
          uVar1 = uVar1 + 1;
          iVar40 = iVar40 + 1;
        } while (iVar40 < (pOVar39->m_li).m_count);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != new_capacity);
    pOVar30 = sub_brep;
    if (sub_brep == (ON_Brep *)0x0) {
      sub_brep = New();
      local_b0.m_p = sub_brep;
      pOVar30 = local_b0.m_sub_brep;
    }
    local_b0.m_sub_brep = pOVar30;
    if ((uint)(sub_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
              m_capacity < (uint)subfi_count) {
      ON_ClassArray<ON_BrepFace>::SetCapacity
                ((ON_ClassArray<ON_BrepFace> *)&sub_brep->m_F,new_capacity);
    }
    if ((uint)(sub_brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
              m_capacity < uVar1) {
      ON_ClassArray<ON_BrepLoop>::SetCapacity
                ((ON_ClassArray<ON_BrepLoop> *)&sub_brep->m_L,(long)(int)uVar1);
    }
    if ((uint)(sub_brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
              m_capacity < local_f8) {
      ON_ClassArray<ON_BrepTrim>::SetCapacity
                ((ON_ClassArray<ON_BrepTrim> *)&sub_brep->m_T,(long)(int)local_f8);
    }
    if ((uint)(sub_brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              m_capacity < local_f4) {
      ON_ClassArray<ON_BrepEdge>::SetCapacity
                ((ON_ClassArray<ON_BrepEdge> *)&sub_brep->m_E,(long)(int)local_f4);
    }
    if ((uint)(sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
              .m_capacity < uVar27) {
      ON_ClassArray<ON_BrepVertex>::SetCapacity
                ((ON_ClassArray<ON_BrepVertex> *)&sub_brep->m_V,(long)(int)uVar27);
    }
    if ((uint)(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < (uint)subfi_count) {
      ON_SimpleArray<ON_Surface_*>::SetCapacity
                (&(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>,new_capacity);
    }
    if ((uint)(sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_f8) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_f8);
    }
    if ((uint)(sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_f4) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_f4);
    }
    if (0 < (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
            m_count) {
      lVar28 = 0;
      lVar41 = 0;
      do {
        if (__s_00[lVar41] == 0) {
          __s_00[lVar41] = -1;
        }
        else {
          pOVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                   super_ON_ClassArray<ON_BrepVertex>.m_a;
          vertex_point.z = *(double *)((long)&(pOVar4->super_ON_Point).point.z + lVar28);
          vertex_point._0_16_ =
               *(undefined1 (*) [16])((long)&(pOVar4->super_ON_Point).point.x + lVar28);
          this_00 = NewVertex(sub_brep,vertex_point,*(double *)((long)&pOVar4->m_tolerance + lVar28)
                             );
          __s_00[lVar41] = this_00->m_vertex_index;
          ON_Object::CopyUserData
                    ((ON_Object *)this_00,
                     (ON_Object *)
                     ((long)&(pOVar4->super_ON_Point).super_ON_Geometry.super_ON_Object.
                             _vptr_ON_Object + lVar28));
          this_00->m_vertex_user = *(ON_U *)((long)&pOVar4->m_vertex_user + lVar28);
        }
        lVar41 = lVar41 + 1;
        lVar28 = lVar28 + 0x58;
      } while (lVar41 < (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                        super_ON_ClassArray<ON_BrepVertex>.m_count);
    }
    if (0 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count)
    {
      local_118 = (ON_Brep *)0x0;
      lVar41 = 0;
      lVar28 = 0;
      do {
        if (__s[lVar28] == 0) {
          __s[lVar28] = -1;
        }
        else {
          pOVar32 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                    m_a;
          if ((__s_00[*(int *)((long)pOVar32->m_vi + lVar41)] < 0) ||
             (__s_00[*(int *)((long)pOVar32->m_vi + lVar41 + 4)] < 0)) goto LAB_0040cb5a;
          src = (ON_Object *)
                ((long)&(((ON_CurveProxy *)
                         (&(pOVar32->super_ON_CurveProxy).m_real_curve_domain + -2))->super_ON_Curve
                        ).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar41);
          iVar40 = (*src->_vptr_ON_Object[0x24])(src);
          local_90.m_min.x = (double)CONCAT44(extraout_var,iVar40);
          if (local_90.m_min.x == 0.0) goto LAB_0040cb51;
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_90);
          pOVar4 = (sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                   super_ON_ClassArray<ON_BrepVertex>.m_a;
          this_01 = NewEdge(sub_brep,pOVar4 + __s_00[*(int *)((long)pOVar32->m_vi + lVar41)],
                            pOVar4 + __s_00[*(int *)((long)pOVar32->m_vi + lVar41 + 4)],
                            (sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count + -1,
                            (ON_Interval *)0x0,*(double *)((long)pOVar32->m_vi + lVar41 + 0x24));
          __s[lVar28] = this_01->m_edge_index;
          ON_Object::CopyUserData((ON_Object *)this_01,src);
          this_01->m_edge_user = *(ON_U *)((long)pOVar32->m_vi + lVar41 + -0x14);
        }
        lVar28 = lVar28 + 1;
        lVar41 = lVar41 + 0x88;
      } while (lVar28 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                        super_ON_ClassArray<ON_BrepEdge>.m_count);
    }
    bVar25 = ON_BoundingBox::IsValid(&this->m_bbox);
    ON_BoundingBox::ON_BoundingBox(&local_90);
    uVar38 = 0;
    do {
      pOVar33 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      pOVar39 = pOVar33 + subfi[uVar38];
      iVar40 = (*pOVar33[subfi[uVar38]].super_ON_SurfaceProxy.super_ON_Surface.super_ON_Geometry.
                 super_ON_Object._vptr_ON_Object[0x24])();
      local_60.m_min.x = (double)CONCAT44(extraout_var_00,iVar40);
      if (local_60.m_min.x == 0.0) goto LAB_0040cb51;
      ON_SimpleArray<ON_Surface_*>::Append
                (&(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>,(ON_Surface **)&local_60);
      pOVar33 = NewFace(sub_brep,(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count + -1);
      ON_Object::CopyUserData((ON_Object *)pOVar33,(ON_Object *)pOVar39);
      pOVar33->m_bRev = pOVar39->m_bRev;
      pOVar33->m_face_material_channel = pOVar39->m_face_material_channel;
      uVar22 = (pOVar39->m_face_uuid).Data2;
      uVar23 = (pOVar39->m_face_uuid).Data3;
      uVar16 = *(undefined8 *)(pOVar39->m_face_uuid).Data4;
      (pOVar33->m_face_uuid).Data1 = (pOVar39->m_face_uuid).Data1;
      (pOVar33->m_face_uuid).Data2 = uVar22;
      (pOVar33->m_face_uuid).Data3 = uVar23;
      *(undefined8 *)(pOVar33->m_face_uuid).Data4 = uVar16;
      dVar17 = (pOVar39->m_bbox).m_min.x;
      dVar18 = (pOVar39->m_bbox).m_min.y;
      dVar19 = (pOVar39->m_bbox).m_min.z;
      dVar20 = (pOVar39->m_bbox).m_max.x;
      dVar21 = (pOVar39->m_bbox).m_max.z;
      (pOVar33->m_bbox).m_max.y = (pOVar39->m_bbox).m_max.y;
      (pOVar33->m_bbox).m_max.z = dVar21;
      (pOVar33->m_bbox).m_min.z = dVar19;
      (pOVar33->m_bbox).m_max.x = dVar20;
      (pOVar33->m_bbox).m_min.x = dVar17;
      (pOVar33->m_bbox).m_min.y = dVar18;
      uVar16 = *(undefined8 *)&pOVar39->field_0xa0;
      *(undefined8 *)&pOVar33->field_0x98 = *(undefined8 *)&pOVar39->field_0x98;
      *(undefined8 *)&pOVar33->field_0xa0 = uVar16;
      uVar16 = *(undefined8 *)&pOVar39->field_0xb0;
      *(undefined8 *)&pOVar33->field_0xa8 = *(undefined8 *)&pOVar39->field_0xa8;
      *(undefined8 *)&pOVar33->field_0xb0 = uVar16;
      pOVar33->m_face_user = pOVar39->m_face_user;
      if (bVar25 != false) {
        bVar26 = ON_BoundingBox::IsValid(&pOVar33->m_bbox);
        if (bVar26) {
          ON_BoundingBox::Union(&local_90,&pOVar33->m_bbox);
        }
        else {
          ON_BoundingBox::Destroy(&local_90);
          bVar25 = false;
        }
      }
      if (0 < (pOVar39->m_li).m_count) {
        lVar28 = 0;
        do {
          iVar40 = (pOVar39->m_li).m_a[lVar28];
          pOVar29 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                    m_a;
          loop = NewLoop(sub_brep,pOVar29[iVar40].m_type,pOVar33);
          pOVar29 = pOVar29 + iVar40;
          ON_Object::CopyUserData((ON_Object *)loop,(ON_Object *)pOVar29);
          uVar5 = *(undefined4 *)&(pOVar29->m_pbox).m_min.x;
          uVar6 = *(undefined4 *)((long)&(pOVar29->m_pbox).m_min.x + 4);
          uVar7 = *(undefined4 *)&(pOVar29->m_pbox).m_min.y;
          uVar8 = *(undefined4 *)((long)&(pOVar29->m_pbox).m_min.y + 4);
          uVar9 = *(undefined4 *)&(pOVar29->m_pbox).m_min.z;
          uVar10 = *(undefined4 *)((long)&(pOVar29->m_pbox).m_min.z + 4);
          uVar11 = *(undefined4 *)&(pOVar29->m_pbox).m_max.x;
          uVar12 = *(undefined4 *)((long)&(pOVar29->m_pbox).m_max.x + 4);
          uVar13 = *(undefined4 *)((long)&(pOVar29->m_pbox).m_max.y + 4);
          uVar14 = *(undefined4 *)&(pOVar29->m_pbox).m_max.z;
          uVar15 = *(undefined4 *)((long)&(pOVar29->m_pbox).m_max.z + 4);
          *(undefined4 *)&(loop->m_pbox).m_max.y = *(undefined4 *)&(pOVar29->m_pbox).m_max.y;
          *(undefined4 *)((long)&(loop->m_pbox).m_max.y + 4) = uVar13;
          *(undefined4 *)&(loop->m_pbox).m_max.z = uVar14;
          *(undefined4 *)((long)&(loop->m_pbox).m_max.z + 4) = uVar15;
          *(undefined4 *)&(loop->m_pbox).m_min.z = uVar9;
          *(undefined4 *)((long)&(loop->m_pbox).m_min.z + 4) = uVar10;
          *(undefined4 *)&(loop->m_pbox).m_max.x = uVar11;
          *(undefined4 *)((long)&(loop->m_pbox).m_max.x + 4) = uVar12;
          *(undefined4 *)&(loop->m_pbox).m_min.x = uVar5;
          *(undefined4 *)((long)&(loop->m_pbox).m_min.x + 4) = uVar6;
          *(undefined4 *)&(loop->m_pbox).m_min.y = uVar7;
          *(undefined4 *)((long)&(loop->m_pbox).m_min.y + 4) = uVar8;
          loop->m_loop_user = pOVar29->m_loop_user;
          if (0 < (pOVar29->m_ti).m_count) {
            lVar41 = 0;
            do {
              iVar40 = (pOVar29->m_ti).m_a[lVar41];
              pOVar31 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                        super_ON_ClassArray<ON_BrepTrim>.m_a;
              if ((__s_00[pOVar31[iVar40].m_vi[0]] < 0) ||
                 (pOVar31 = pOVar31 + iVar40, __s_00[pOVar31->m_vi[1]] < 0)) goto LAB_0040cb51;
              uVar27 = pOVar31->m_ei;
              if ((-1 < (long)(int)uVar27) && (__s[(int)uVar27] < 0)) goto LAB_0040cb51;
              if (pOVar31->m_c2i < 0) {
                if (pOVar31->m_type != ptonsrf) goto LAB_0040cb51;
              }
              else {
                iVar40 = (*(pOVar31->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                           super_ON_Object._vptr_ON_Object[0x24])(pOVar31);
                local_b8 = (ON_Curve *)CONCAT44(extraout_var_01,iVar40);
                if (local_b8 == (ON_Curve *)0x0) goto LAB_0040cb51;
                ON_SimpleArray<ON_Curve_*>::Append
                          (&(sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>,&local_b8);
                uVar27 = pOVar31->m_ei;
              }
              if ((int)uVar27 < 0) {
                if (pOVar31->m_type == ptonsrf) {
                  pOVar34 = NewTrim(sub_brep,false,loop,-1);
                  pOVar34->m_type = ptonsrf;
                  iVar40 = (sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                           super_ON_ClassArray<ON_BrepVertex>.m_a[__s_00[pOVar31->m_vi[0]]].
                           m_vertex_index;
                  pOVar34->m_vi[1] = iVar40;
                  pOVar34->m_vi[0] = iVar40;
                }
                else {
                  if (pOVar31->m_type != singular) goto LAB_0040cb51;
                  NewSingularTrim(sub_brep,(sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                                           super_ON_ClassArray<ON_BrepVertex>.m_a +
                                           __s_00[pOVar31->m_vi[0]],loop,pOVar31->m_iso,
                                  (sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count + -1);
                }
              }
              else {
                NewTrim(sub_brep,(sub_brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                 super_ON_ClassArray<ON_BrepEdge>.m_a + __s[uVar27],
                        pOVar31->m_bRev3d,loop,
                        (sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count + -1);
              }
              lVar35 = (long)(sub_brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                             super_ON_ClassArray<ON_BrepTrim>.m_count;
              pOVar34 = (sub_brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                        super_ON_ClassArray<ON_BrepTrim>.m_a;
              ON_Object::CopyUserData((ON_Object *)(pOVar34 + lVar35 + -1),(ON_Object *)pOVar31);
              dVar17 = pOVar31->m__legacy_3d_tol;
              pOVar34[lVar35 + -1].m__legacy_2d_tol = pOVar31->m__legacy_2d_tol;
              pOVar34[lVar35 + -1].m__legacy_3d_tol = dVar17;
              pOVar34[lVar35 + -1].m__legacy_flags = pOVar31->m__legacy_flags;
              pOVar34[lVar35 + -1].m_tolerance[0] = pOVar31->m_tolerance[0];
              pOVar34[lVar35 + -1].m_tolerance[1] = pOVar31->m_tolerance[1];
              uVar5 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_min.x + 4);
              uVar6 = *(undefined4 *)&(pOVar31->m_pbox).m_min.y;
              uVar7 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_min.y + 4);
              uVar8 = *(undefined4 *)&(pOVar31->m_pbox).m_min.z;
              uVar9 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_min.z + 4);
              uVar10 = *(undefined4 *)&(pOVar31->m_pbox).m_max.x;
              uVar11 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_max.x + 4);
              uVar12 = *(undefined4 *)&(pOVar31->m_pbox).m_max.y;
              uVar13 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_max.y + 4);
              uVar14 = *(undefined4 *)&(pOVar31->m_pbox).m_max.z;
              uVar15 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_max.z + 4);
              *(undefined4 *)&pOVar34[lVar35 + -1].m_pbox.m_min.x =
                   *(undefined4 *)&(pOVar31->m_pbox).m_min.x;
              *(undefined4 *)((long)&pOVar34[lVar35 + -1].m_pbox.m_min.x + 4) = uVar5;
              *(undefined4 *)&pOVar34[lVar35 + -1].m_pbox.m_min.y = uVar6;
              *(undefined4 *)((long)&pOVar34[lVar35 + -1].m_pbox.m_min.y + 4) = uVar7;
              *(undefined4 *)&pOVar34[lVar35 + -1].m_pbox.m_min.z = uVar8;
              *(undefined4 *)((long)&pOVar34[lVar35 + -1].m_pbox.m_min.z + 4) = uVar9;
              *(undefined4 *)&pOVar34[lVar35 + -1].m_pbox.m_max.x = uVar10;
              *(undefined4 *)((long)&pOVar34[lVar35 + -1].m_pbox.m_max.x + 4) = uVar11;
              *(undefined4 *)&pOVar34[lVar35 + -1].m_pbox.m_max.y = uVar12;
              *(undefined4 *)((long)&pOVar34[lVar35 + -1].m_pbox.m_max.y + 4) = uVar13;
              *(undefined4 *)&pOVar34[lVar35 + -1].m_pbox.m_max.z = uVar14;
              *(undefined4 *)((long)&pOVar34[lVar35 + -1].m_pbox.m_max.z + 4) = uVar15;
              pOVar34[lVar35 + -1].m_iso = pOVar31->m_iso;
              pOVar34[lVar35 + -1].m_trim_user = pOVar31->m_trim_user;
              if (pOVar31->m_type != mated) {
                pOVar34[lVar35 + -1].m_type = pOVar31->m_type;
              }
              lVar41 = lVar41 + 1;
            } while (lVar41 < (pOVar29->m_ti).m_count);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < (pOVar39->m_li).m_count);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != new_capacity);
    if ((bVar25 == false) || (bVar25 = ON_BoundingBox::IsValid(&local_90), !bVar25)) {
      ON_Geometry::BoundingBox(&local_60,&sub_brep->super_ON_Geometry);
    }
    else {
      (sub_brep->m_bbox).m_max.y = local_90.m_max.y;
      (sub_brep->m_bbox).m_max.z = local_90.m_max.z;
      (sub_brep->m_bbox).m_min.z = local_90.m_min.z;
      (sub_brep->m_bbox).m_max.x = local_90.m_max.x;
      (sub_brep->m_bbox).m_min.x = local_90.m_min.x;
      (sub_brep->m_bbox).m_min.y = local_90.m_min.y;
    }
    local_b0.m_p = (ON_Brep *)0x0;
    local_b0.m_sub_brep = (ON_Brep *)0x0;
    local_118 = sub_brep;
  }
LAB_0040cb5a:
  SubBrep::LeakStopper::~LeakStopper(&local_b0);
  return local_118;
}

Assistant:

ON_Brep* ON_Brep::SubBrep( 
          int subfi_count, 
          const int* subfi, 
          ON_Brep* sub_brep
          ) const
{
  class LeakStopper : public ON_Workspace
  {
    // If an error occures during construction,
    // this class cleans up sub_brep in an
    // appropriate fashion.
  public:
    LeakStopper() {m_p=0;m_sub_brep=0;}
    ~LeakStopper() {if (m_p) delete m_p; else if (m_sub_brep) m_sub_brep->Destroy();}
    ON_Brep* m_p;        // ON_Brep::SubBrep allocated sub_brep
    ON_Brep* m_sub_brep; // user's sub_brep argument
  };
  LeakStopper leak_stopper;

  if ( sub_brep )
    sub_brep->Destroy();

  if ( subfi_count <= 0 || 0 == subfi )
    return 0;

  if ( subfi_count > m_F.Count() )
    return 0;

  // validate indices in extract_fi[] and
  // make sure there are no duplicates.
  int fi, fli, lti, i, j;
  int Lcount = 0;
  int Tcount = 0;
  int Ecount = 0;
  int Vcount = 0;
  int maxfi = -1;
  int minfi = m_F.Count();
  int* Emap = leak_stopper.GetIntMemory(m_E.Count());
  memset(Emap,0,m_E.Count()*sizeof(Emap[0]));
  int* Vmap = leak_stopper.GetIntMemory(m_V.Count());
  memset(Vmap,0,m_V.Count()*sizeof(Vmap[0]));
  for ( i = 0; i < subfi_count; i++ )
  {
    fi = subfi[i];
    if ( fi < 0 || fi >= m_F.Count() )
    {
      ON_ERROR("ON_Brep::SubBrep sub_fi[] has invalid indices");
      return 0;
    }
    if ( fi > maxfi )
      maxfi = fi;
    else if ( fi < minfi )
      minfi = fi;
    else
    {
      for ( j = 0; j < i; j++ )
      {
        if ( subfi[j] == fi )
        {
          ON_ERROR("ON_Brep::SubBrep sub_fi[] has duplicate indices");
          return 0;
        }
      }
    }

    const ON_BrepFace& face = m_F[fi];
    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = face.Loop(fli);
      if ( !loop || this != loop->Brep() )
        return 0;
      Lcount++;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = loop->Trim(lti);
        if ( !trim || this != trim->Brep() )
          return 0;
        Tcount++;
        if ( trim->m_vi[0] < 0 || trim->m_vi[0] >= m_V.Count() )
          return 0;
        if ( trim->m_vi[1] < 0 || trim->m_vi[1] >= m_V.Count() )
          return 0;
        if ( 0 == Vmap[trim->m_vi[0]] )
        {
          Vmap[trim->m_vi[0]] = 1;
          Vcount++;
        }
        if ( 0 == Vmap[trim->m_vi[1]] )
        {
          Vmap[trim->m_vi[1]] = 1;
          Vcount++;
        }
        if ( ON_BrepTrim::singular == trim->m_type ||
             ON_BrepTrim::ptonsrf == trim->m_type)   // March 29, 2010 Lowell - Allow ptonsrf
        {
          if ( trim->m_ei >= 0 || trim->m_vi[0] != trim->m_vi[1] )
            return 0;
        }
        else if ( trim->m_ei >= 0 )
        {
          const ON_BrepEdge* edge = trim->Edge();
          if ( 0 == edge || this != edge->Brep() )
            return 0;
          if ( 0 == Emap[trim->m_ei] )
          {
            Emap[trim->m_ei] = 1;
            Ecount++;
            // edge's vertices should already be mapped.
            if ( 0 == Vmap[edge->m_vi[0]] )
              return 0;
            if ( 0 == Vmap[edge->m_vi[1]] )
              return 0;
          }          
        }
        else
        {
          return 0;
        }
      }
    }
  }

  if ( !sub_brep )
  {
    sub_brep = ON_Brep::New();
    leak_stopper.m_p = sub_brep;
  }
  else
  {
    leak_stopper.m_sub_brep = sub_brep;
  }

  sub_brep->m_F.Reserve(subfi_count);
  sub_brep->m_L.Reserve(Lcount);
  sub_brep->m_T.Reserve(Tcount);
  sub_brep->m_E.Reserve(Ecount);
  sub_brep->m_V.Reserve(Vcount);
  sub_brep->m_S.Reserve(subfi_count);
  sub_brep->m_C2.Reserve(Tcount);
  sub_brep->m_C3.Reserve(Ecount);

  // build sub_brep vertices
  for ( i = 0; i < m_V.Count(); i++ )
  {
    if ( Vmap[i] )
    {
      const ON_BrepVertex& vertex = m_V[i];
      ON_BrepVertex& sub_vertex = sub_brep->NewVertex(vertex.point,vertex.m_tolerance);
      Vmap[i] = sub_vertex.m_vertex_index;
      sub_vertex.CopyUserData(vertex);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_vertex.m_vertex_user, &vertex.m_vertex_user, sizeof(sub_vertex.m_vertex_user));
    }
    else
      Vmap[i] = -1;
  }

  // build sub_brep edges
  for ( i = 0; i < m_E.Count(); i++ )
  {
    if ( Emap[i] )
    {
      const ON_BrepEdge& edge = m_E[i];
      if ( Vmap[edge.m_vi[0]] < 0 )
        return 0;
      if ( Vmap[edge.m_vi[1]] < 0 )
        return 0;
      ON_Curve* c3 = edge.DuplicateCurve();
      if ( 0 == c3 )
        return 0;
      sub_brep->m_C3.Append(c3);
      ON_BrepVertex& sub_v0 = sub_brep->m_V[Vmap[edge.m_vi[0]]];
      ON_BrepVertex& sub_v1 = sub_brep->m_V[Vmap[edge.m_vi[1]]];
      ON_BrepEdge& sub_edge = sub_brep->NewEdge(sub_v0,sub_v1,sub_brep->m_C3.Count()-1,0,edge.m_tolerance);
      Emap[i] = sub_edge.m_edge_index;
      sub_edge.CopyUserData(edge);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_edge.m_edge_user, &edge.m_edge_user, sizeof(sub_edge.m_edge_user));
    }
    else
      Emap[i] = -1;
  }

  bool bHaveBBox = m_bbox.IsValid();
  ON_BoundingBox sub_bbox;

  for ( i = 0; i < subfi_count; i++ )
  {
    const ON_BrepFace& face = m_F[subfi[i]];
    ON_Surface* srf = face.DuplicateSurface();
    if (!srf)
      return 0;
    sub_brep->m_S.Append(srf);
    ON_BrepFace& sub_face = sub_brep->NewFace(sub_brep->m_S.Count()-1);
    sub_face.CopyUserData(face);
    sub_face.m_bRev = face.m_bRev;
    sub_face.m_face_material_channel = face.m_face_material_channel;
    sub_face.m_face_uuid = face.m_face_uuid;
    sub_face.m_bbox = face.m_bbox;
    sub_face.m_domain[0] = face.m_domain[0];
    sub_face.m_domain[1] = face.m_domain[1];
    // March 29, 2010 Lowell - Copy user fields
    memcpy(&sub_face.m_face_user, &face.m_face_user, sizeof(sub_face.m_face_user));

    if ( bHaveBBox )
    {
      if ( sub_face.m_bbox.IsValid() )
        sub_bbox.Union(sub_face.m_bbox);
      else
      {
        bHaveBBox = false;
        sub_bbox.Destroy();
      }
    }


    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop& loop = m_L[face.m_li[fli]];
      ON_BrepLoop& sub_loop = sub_brep->NewLoop(loop.m_type,sub_face);
      sub_loop.CopyUserData(loop);
      sub_loop.m_pbox = loop.m_pbox;
      // April 19, 2010 Lowell - Copy user fields
      memcpy(&sub_loop.m_loop_user, &loop.m_loop_user, sizeof(sub_loop.m_loop_user));

      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        const ON_BrepTrim& trim = m_T[loop.m_ti[lti]];
        if ( Vmap[trim.m_vi[0]] < 0 || Vmap[trim.m_vi[1]] < 0 )
          return 0;
        if ( trim.m_ei >= 0 && Emap[trim.m_ei] < 0 )
          return 0;
        if(trim.m_c2i >= 0)
        {
          ON_Curve* c2 = trim.DuplicateCurve();
          if ( !c2 )
            return 0;
          sub_brep->m_C2.Append(c2);
        }
        else if(trim.m_type != ON_BrepTrim::ptonsrf)
          return 0;
        if ( trim.m_ei >= 0 )
        {
          ON_BrepEdge& sub_edge = sub_brep->m_E[Emap[trim.m_ei]];
          sub_brep->NewTrim(sub_edge,trim.m_bRev3d,sub_loop,sub_brep->m_C2.Count()-1);
        }
        else if ( ON_BrepTrim::singular == trim.m_type )
        {
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_brep->NewSingularTrim(sub_vertex,sub_loop,trim.m_iso,sub_brep->m_C2.Count()-1);
        }
        // March 29, 2010 Lowell - copy ptonsrf type
        else if ( ON_BrepTrim::ptonsrf == trim.m_type)
        {
          ON_BrepTrim& sub_trim = sub_brep->NewTrim(false, sub_loop, -1);
          sub_trim.m_type = ON_BrepTrim::ptonsrf;
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_trim.m_vi[0] = sub_trim.m_vi[1] = sub_vertex.m_vertex_index;
        }
        else
        {
          return 0;
        }
        ON_BrepTrim& sub_trim = sub_brep->m_T[sub_brep->m_T.Count()-1];
        sub_trim.CopyUserData(trim);
        sub_trim.m__legacy_2d_tol = trim.m__legacy_2d_tol;
        sub_trim.m__legacy_3d_tol = trim.m__legacy_3d_tol;
        sub_trim.m__legacy_flags = trim.m__legacy_flags;
        sub_trim.m_tolerance[0] = trim.m_tolerance[0];
        sub_trim.m_tolerance[1] = trim.m_tolerance[1];
        sub_trim.m_pbox = trim.m_pbox;
        sub_trim.m_iso = trim.m_iso;
        // April 19, 2010 Lowell - Copy user fields
        memcpy(&sub_trim.m_trim_user, &trim.m_trim_user, sizeof(sub_trim.m_trim_user));

        // Since we are extracting a subset of the original brep,
        // some mated edges could turn into boundary edges. The
        // call to NewTrim() above will correctly handle setting
        // and updating sub_trims that came from mated trims.
        if ( ON_BrepTrim::mated != trim.m_type )
          sub_trim.m_type = trim.m_type;
      }
    }
  }

  if ( !bHaveBBox || !sub_bbox.IsValid() )
    sub_brep->BoundingBox();
  else
    sub_brep->m_bbox = sub_bbox;

  // return subbrep after disabling the leak stopper
  leak_stopper.m_p = 0;
  leak_stopper.m_sub_brep = 0;
  return sub_brep;
}